

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalStreamingSample,duckdb::vector<duckdb::LogicalType,true>&,duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,
          unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
          *args_1,unsigned_long *args_2)

{
  PhysicalStreamingSample *this_00;
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> local_58;
  reference_wrapper<duckdb::PhysicalOperator> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this_00 = (PhysicalStreamingSample *)ArenaAllocator::AllocateAligned(&this->arena,0x90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_58._M_head_impl =
       (args_1->super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  (args_1->super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>).
  _M_t.super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  PhysicalStreamingSample::PhysicalStreamingSample
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_48,
             (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             &local_58,*args_2);
  ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::~unique_ptr
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  local_50._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_50);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}